

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmodule.c
# Opt level: O0

FT_Error af_property_get(FT_Module ft_module,char *property_name,void *value)

{
  AF_Script AVar1;
  int iVar2;
  FT_Bool *val_3;
  FT_Bool no_stem_darkening;
  FT_Int *val_2;
  FT_Int *darken_params;
  AF_FaceGlobals globals_1;
  FT_Prop_IncreaseXHeight *prop_1;
  AF_Script *val_1;
  AF_StyleClass style_class;
  AF_Script *val;
  AF_FaceGlobals globals;
  FT_Prop_GlyphToScriptMap *prop;
  AF_Module module;
  AF_FaceGlobals pAStack_28;
  FT_Error error;
  void *value_local;
  char *property_name_local;
  FT_Module ft_module_local;
  
  module._4_4_ = 0;
  prop = (FT_Prop_GlyphToScriptMap *)ft_module;
  pAStack_28 = (AF_FaceGlobals)value;
  value_local = property_name;
  property_name_local = (char *)ft_module;
  iVar2 = strcmp(property_name,"glyph-to-script-map");
  if (iVar2 == 0) {
    globals = pAStack_28;
    ft_module_local._4_4_ =
         af_property_get_face_globals(pAStack_28->face,(AF_FaceGlobals *)&val,(AF_Module)prop);
    if (ft_module_local._4_4_ == 0) {
      AVar1 = val[5];
      globals->glyph_count = val[4];
      *(AF_Script *)&globals->field_0xc = AVar1;
    }
  }
  else {
    iVar2 = strcmp((char *)value_local,"fallback-script");
    if (iVar2 == 0) {
      *(AF_Script *)&pAStack_28->face = af_style_classes[*(uint *)&prop[1].map]->script;
      ft_module_local._4_4_ = module._4_4_;
    }
    else {
      iVar2 = strcmp((char *)value_local,"default-script");
      if (iVar2 == 0) {
        *(undefined4 *)&pAStack_28->face = *(undefined4 *)((long)&prop[1].map + 4);
        ft_module_local._4_4_ = module._4_4_;
      }
      else {
        iVar2 = strcmp((char *)value_local,"increase-x-height");
        if (iVar2 == 0) {
          globals_1 = pAStack_28;
          ft_module_local._4_4_ =
               af_property_get_face_globals
                         (pAStack_28->face,(AF_FaceGlobals *)&darken_params,(AF_Module)prop);
          if (ft_module_local._4_4_ == 0) {
            globals_1->glyph_count = darken_params[6];
          }
        }
        else {
          iVar2 = strcmp((char *)value_local,"darkening-parameters");
          if (iVar2 == 0) {
            *(undefined4 *)&pAStack_28->face = *(undefined4 *)((long)&prop[2].face + 4);
            *(undefined4 *)((long)&pAStack_28->face + 4) = *(undefined4 *)&prop[2].map;
            pAStack_28->glyph_count = *(FT_UInt *)((long)&prop[2].map + 4);
            *(undefined4 *)&pAStack_28->field_0xc = *(undefined4 *)&prop[3].face;
            *(undefined4 *)&pAStack_28->glyph_styles = *(undefined4 *)((long)&prop[3].face + 4);
            *(undefined4 *)((long)&pAStack_28->glyph_styles + 4) = *(undefined4 *)&prop[3].map;
            pAStack_28->increase_x_height = *(FT_UInt *)((long)&prop[3].map + 4);
            *(undefined4 *)&pAStack_28->field_0x1c = *(undefined4 *)&prop[4].face;
            ft_module_local._4_4_ = module._4_4_;
          }
          else {
            iVar2 = strcmp((char *)value_local,"no-stem-darkening");
            if (iVar2 == 0) {
              *(undefined1 *)&pAStack_28->face = *(undefined1 *)&prop[2].face;
              ft_module_local._4_4_ = module._4_4_;
            }
            else {
              ft_module_local._4_4_ = 0xc;
            }
          }
        }
      }
    }
  }
  return ft_module_local._4_4_;
}

Assistant:

static FT_Error
  af_property_get( FT_Module    ft_module,
                   const char*  property_name,
                   void*        value )
  {
    FT_Error   error          = FT_Err_Ok;
    AF_Module  module         = (AF_Module)ft_module;


    if ( !ft_strcmp( property_name, "glyph-to-script-map" ) )
    {
      FT_Prop_GlyphToScriptMap*  prop = (FT_Prop_GlyphToScriptMap*)value;
      AF_FaceGlobals             globals;


      error = af_property_get_face_globals( prop->face, &globals, module );
      if ( !error )
        prop->map = globals->glyph_styles;

      return error;
    }
    else if ( !ft_strcmp( property_name, "fallback-script" ) )
    {
      AF_Script*  val = (AF_Script*)value;

      AF_StyleClass  style_class = af_style_classes[module->fallback_style];


      *val = style_class->script;

      return error;
    }
    else if ( !ft_strcmp( property_name, "default-script" ) )
    {
      AF_Script*  val = (AF_Script*)value;


      *val = module->default_script;

      return error;
    }
    else if ( !ft_strcmp( property_name, "increase-x-height" ) )
    {
      FT_Prop_IncreaseXHeight*  prop = (FT_Prop_IncreaseXHeight*)value;
      AF_FaceGlobals            globals;


      error = af_property_get_face_globals( prop->face, &globals, module );
      if ( !error )
        prop->limit = globals->increase_x_height;

      return error;
    }
    else if ( !ft_strcmp( property_name, "darkening-parameters" ) )
    {
      FT_Int*  darken_params = module->darken_params;
      FT_Int*  val           = (FT_Int*)value;


      val[0] = darken_params[0];
      val[1] = darken_params[1];
      val[2] = darken_params[2];
      val[3] = darken_params[3];
      val[4] = darken_params[4];
      val[5] = darken_params[5];
      val[6] = darken_params[6];
      val[7] = darken_params[7];

      return error;
    }
    else if ( !ft_strcmp( property_name, "no-stem-darkening" ) )
    {
      FT_Bool   no_stem_darkening = module->no_stem_darkening;
      FT_Bool*  val               = (FT_Bool*)value;


      *val = no_stem_darkening;

      return error;
    }

    FT_TRACE2(( "af_property_get: missing property `%s'\n",
                property_name ));
    return FT_THROW( Missing_Property );
  }